

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O0

void NewtClearMapFlags(newtRefArg map,int32_t bit)

{
  newtRef nVar1;
  ulong uVar2;
  int64_t flags;
  int32_t bit_local;
  newtRefArg map_local;
  
  nVar1 = NcClassOf(map);
  uVar2 = NewtRefToInteger(nVar1);
  nVar1 = NewtMakeInteger((long)(int)(bit ^ 0xffffffff) & uVar2);
  NcSetClass(map,nVar1);
  return;
}

Assistant:

void NewtClearMapFlags(newtRefArg map, int32_t bit)
{
    int64_t	flags;
    
    flags = NewtRefToInteger(NcClassOf(map));
    flags &= ~ bit;
    NcSetClass(map, NewtMakeInteger(flags));
}